

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
basic_cbor_parser<jsoncons::bytes_source>
          (basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,
          bytes_source *source,cbor_decode_options *options,allocator<char> *alloc)

{
  _func_int *p_Var1;
  value_type *pvVar2;
  int local_30 [2];
  
  (this->super_ser_context)._vptr_ser_context = (_func_int **)&PTR__basic_cbor_parser_00b5b9d8;
  this->more_ = true;
  this->done_ = false;
  this->cursor_mode_ = false;
  (this->other_tags_).super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)&this->mark_level_ = 0;
  *(undefined8 *)((long)&this->raw_tag_ + 4) = 0;
  pvVar2 = source->current_;
  (this->source_).data_ = source->data_;
  (this->source_).current_ = pvVar2;
  (this->source_).end_ = source->end_;
  p_Var1 = options->_vptr_cbor_decode_options[-3];
  *(undefined ***)&(this->options_).field_0x8 = &PTR__cbor_options_common_00b5b828;
  *(undefined4 *)&(this->options_).field_0x10 = *(undefined4 *)(&options->field_0x8 + (long)p_Var1);
  (this->options_)._vptr_cbor_decode_options = (_func_int **)0xb5ba40;
  *(undefined8 *)&(this->options_).field_0x8 = 0xb5ba68;
  (this->text_buffer_)._M_dataplus._M_p = (pointer)&(this->text_buffer_).field_2;
  (this->text_buffer_)._M_string_length = 0;
  (this->text_buffer_).field_2._M_local_buf[0] = '\0';
  (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->state_stack_).
  super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->state_stack_).
  super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->state_stack_).
  super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->typed_array_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->typed_array_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->typed_array_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->shape_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->shape_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->shape_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->stringref_map_stack_).
  super__Vector_base<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stringref_map_stack_).
  super__Vector_base<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stringref_map_stack_).
  super__Vector_base<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30[1] = 0;
  local_30[0] = 0;
  std::vector<jsoncons::cbor::parse_state,std::allocator<jsoncons::cbor::parse_state>>::
  emplace_back<jsoncons::cbor::parse_mode,int>
            ((vector<jsoncons::cbor::parse_state,std::allocator<jsoncons::cbor::parse_state>> *)
             &this->state_stack_,(parse_mode *)(local_30 + 1),local_30);
  return;
}

Assistant:

basic_cbor_parser(Sourceable&& source,
                      const cbor_decode_options& options = cbor_decode_options(),
                      const Allocator& alloc = Allocator())
       : alloc_(alloc),
         source_(std::forward<Sourceable>(source)),
         options_(options),
         text_buffer_(alloc),
         bytes_buffer_(alloc),
         state_stack_(alloc),
         typed_array_(alloc),
         stringref_map_stack_(alloc)
    {
        state_stack_.emplace_back(parse_mode::root,0);
    }